

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall
dxil_spv::Converter::Impl::get_ssbo_offset_buffer_id
          (Impl *this,Id *buffer_id,VulkanBinding *buffer_binding,VulkanBinding *offset_binding,
          ResourceKind kind,uint alignment)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Id IVar3;
  LoggingCallback p_Var4;
  void *pvVar5;
  bool bVar6;
  char buffer [4096];
  BindlessInfo local_1018;
  undefined4 uStack_ff4;
  undefined7 uStack_ff0;
  undefined4 uStack_fe9;
  
  *buffer_id = 0;
  bVar6 = true;
  if (2 < (byte)(kind - TypedBuffer)) {
    return true;
  }
  if (buffer_binding->descriptor_type == SSBO) {
    if (kind == TypedBuffer) {
      return true;
    }
    if (((this->options).ssbo_alignment - 1 & alignment) == 0) {
      return true;
    }
    if ((buffer_binding->bindless).use_heap == false) {
      p_Var4 = get_thread_log_callback();
      if (p_Var4 == (LoggingCallback)0x0) {
        get_ssbo_offset_buffer_id();
      }
      else {
        local_1018.binding = 0x69622072;
        uStack_ff4 = 0x656c646e;
        uStack_ff0 = 0x4f425353207373;
        local_1018.descriptor_type = 0x20796c6e;
        local_1018.uav_read = true;
        local_1018.uav_written = true;
        local_1018.uav_coherent = true;
        local_1018.counters = true;
        local_1018.offsets = true;
        local_1018.aliased = true;
        local_1018.relaxed_precision = true;
        local_1018._27_1_ = 0x65;
        local_1018.desc_set = 0x6f662064;
        local_1018.format = 0x6f207369;
        uStack_fe9 = 0xa2e73;
LAB_00115def:
        local_1018.kind = 0x73;
        local_1018._9_3_ = 0x207465;
        local_1018._0_8_ = 0x66666f204f425353;
        pvVar5 = get_thread_log_callback_userdata();
        (*p_Var4)(pvVar5,Error,(char *)&local_1018);
      }
    }
    else {
      if ((offset_binding->bindless).use_heap != true) goto LAB_00115d83;
      p_Var4 = get_thread_log_callback();
      if (p_Var4 != (LoggingCallback)0x0) {
        local_1018.binding = 0x73656c64;
        uStack_ff4 = 0x75622073;
        uStack_ff0 = 0xa2e72656666;
        local_1018.descriptor_type = 0x6d207265;
        local_1018.uav_read = true;
        local_1018.uav_written = true;
        local_1018.uav_coherent = true;
        local_1018.counters = true;
        local_1018.offsets = true;
        local_1018.aliased = true;
        local_1018.relaxed_precision = true;
        local_1018._27_1_ = 0x61;
        local_1018.desc_set = 0x6e696220;
        local_1018.format = 0x66667562;
        goto LAB_00115def;
      }
      get_ssbo_offset_buffer_id();
    }
    bVar6 = false;
  }
  else {
    if ((this->options).bindless_typed_buffer_offsets != true) {
      return true;
    }
    if (((buffer_binding->bindless).use_heap & 1U) == 0) {
      return true;
    }
LAB_00115d83:
    local_1018.uav_read = false;
    local_1018.uav_written = false;
    local_1018.uav_coherent = false;
    local_1018.counters = false;
    local_1018.format = ImageFormatUnknown;
    local_1018.descriptor_type = SSBO;
    local_1018.offsets = true;
    local_1018.aliased = false;
    local_1018.relaxed_precision = false;
    local_1018._27_1_ = 0;
    uVar1 = offset_binding->descriptor_set;
    uVar2 = offset_binding->binding;
    local_1018.type = SRV;
    local_1018.component = U32;
    local_1018._2_2_ = 0;
    local_1018.raw_vecsize = V1;
    local_1018.kind = RawBuffer;
    local_1018._9_3_ = 0;
    local_1018.desc_set = uVar1;
    local_1018.binding = uVar2;
    IVar3 = create_bindless_heap_variable(this,&local_1018);
    *buffer_id = IVar3;
  }
  return bVar6;
}

Assistant:

bool Converter::Impl::get_ssbo_offset_buffer_id(spv::Id &buffer_id,
                                                const VulkanBinding &buffer_binding,
                                                const VulkanBinding &offset_binding,
                                                DXIL::ResourceKind kind, unsigned alignment)
{
	buffer_id = 0;

	bool is_buffer_type = kind == DXIL::ResourceKind::StructuredBuffer ||
	                      kind == DXIL::ResourceKind::RawBuffer ||
	                      kind == DXIL::ResourceKind::TypedBuffer;
	if (!is_buffer_type)
		return true;

	bool use_offsets = false;

	// If we're emitting an SSBO where we expect small alignment, we'll need to carry forward an "offset".
	if (buffer_binding.descriptor_type == VulkanDescriptorType::SSBO)
	{
		if (kind != DXIL::ResourceKind::TypedBuffer && (alignment & (options.ssbo_alignment - 1)) != 0)
		{
			if (!buffer_binding.bindless.use_heap)
			{
				LOGE("SSBO offset is only supported for bindless SSBOs.\n");
				return false;
			}

			if (offset_binding.bindless.use_heap)
			{
				LOGE("SSBO offset buffer must be a bindless buffer.\n");
				return false;
			}

			use_offsets = true;
		}
	}
	else if (options.bindless_typed_buffer_offsets && buffer_binding.bindless.use_heap)
	{
		use_offsets = true;
	}

	if (use_offsets)
	{
		BindlessInfo bindless_info = {};
		bindless_info.descriptor_type = VulkanDescriptorType::SSBO;
		bindless_info.type = DXIL::ResourceType::SRV;
		bindless_info.offsets = true;
		bindless_info.desc_set = offset_binding.descriptor_set;
		bindless_info.binding = offset_binding.binding;
		bindless_info.component = DXIL::ComponentType::U32;
		bindless_info.kind = DXIL::ResourceKind::RawBuffer;
		buffer_id = create_bindless_heap_variable(bindless_info);
	}

	return true;
}